

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::BasicUsageVS::Setup(BasicUsageVS *this)

{
  *(undefined8 *)(this->xfb_buffer_ + 1) = 0;
  this->vao_ = 0;
  this->prog_ = 0;
  this->counter_buffer_[0] = 0;
  this->counter_buffer_[1] = 0;
  this->xfb_buffer_[0] = 0;
  this->xfb_buffer_[1] = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		counter_buffer_[0] = counter_buffer_[1] = 0;
		xfb_buffer_[0] = xfb_buffer_[1] = 0;
		array_buffer_					= 0;
		vao_							= 0;
		prog_							= 0;
		return NO_ERROR;
	}